

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-dda-dump.cpp
# Opt level: O0

void __thiscall Dumper::nodeToDot(Dumper *this,RWNode *node)

{
  bool bVar1;
  int iVar2;
  IDType IVar3;
  size_t sVar4;
  RWBBlock *pRVar5;
  RWNodeCall *this_00;
  reference this_01;
  RWNode *in_RSI;
  RWNode *in_RDI;
  pair<std::_Rb_tree_const_iterator<dg::dda::RWNode_*>,_bool> pVar6;
  Dumper *unaff_retaddr;
  RWNode *undef;
  RWCalledValue *cv;
  iterator __end2;
  iterator __begin2;
  CalleesT *__range2;
  RWNodeCall *C;
  Dumper *in_stack_ffffffffffffffa0;
  __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
  in_stack_ffffffffffffffb8;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  *in_stack_ffffffffffffffc0;
  RWNode *node_00;
  
  node_00 = in_RDI;
  if ((nodeToDot(dg::dda::RWNode*)::_dumped == '\0') &&
     (iVar2 = __cxa_guard_acquire(&nodeToDot(dg::dda::RWNode*)::_dumped), iVar2 != 0)) {
    std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
    set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *)
        0x17aadd);
    __cxa_atexit(std::
                 set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                 ::~set,&nodeToDot::_dumped,&__dso_handle);
    __cxa_guard_release(&nodeToDot(dg::dda::RWNode*)::_dumped);
  }
  pVar6 = std::
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
          insert(in_stack_ffffffffffffffc0,(value_type *)in_stack_ffffffffffffffb8._M_current);
  if (((pVar6.second ^ 0xffU) & 1) == 0) {
    printf("\tNODE%p ",in_RSI);
    IVar3 = dg::SubgraphNode<dg::dda::RWNode>::getID((SubgraphNode<dg::dda::RWNode> *)(in_RSI + 8));
    printf("[label=<<table border=\"0\"><tr><td>(%u)</td> ",(ulong)IVar3);
    printf("<td><font color=\"#af0000\">");
    printName(unaff_retaddr,node_00);
    printf("</font></td>");
    printf("</tr>\n");
    sVar4 = dg::SubgraphNode<dg::dda::RWNode>::getSize
                      ((SubgraphNode<dg::dda::RWNode> *)(in_RSI + 8));
    if (sVar4 != 0) {
      sVar4 = dg::SubgraphNode<dg::dda::RWNode>::getSize
                        ((SubgraphNode<dg::dda::RWNode> *)(in_RSI + 8));
      printf("<tr><td></td><td>size: %zu</td></tr>\n",sVar4);
    }
    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x17abef);
    if (bVar1) {
      printf("<tr><td>type:</td><td>");
      dg::dda::RWNode::getType(in_RSI);
      printRWNodeType((RWNodeType)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      printf("</td></tr>\n");
      pRVar5 = dg::dda::RWNode::getBBlock(in_RSI);
      printf("<tr><td colspan=\"2\">bblock: %p</td></tr>\n",pRVar5);
      dumpDefines(in_stack_ffffffffffffffa0,in_RDI);
      dumpOverwrites(in_stack_ffffffffffffffa0,in_RDI);
      dumpUses(in_stack_ffffffffffffffa0,in_RDI);
    }
    this_00 = dg::dda::RWNodeCall::get((RWNode *)in_stack_ffffffffffffffa0);
    if (this_00 != (RWNodeCall *)0x0) {
      dg::dda::RWNodeCall::getCallees(this_00);
      std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::begin
                ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)in_RDI);
      std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>::end
                ((vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_> *)in_RDI);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                                 *)in_stack_ffffffffffffffa0,
                                (__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                                 *)in_RDI), bVar1) {
        this_01 = __gnu_cxx::
                  __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                  ::operator*((__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                               *)&stack0xffffffffffffffb8);
        in_stack_ffffffffffffffa0 = (Dumper *)dg::dda::RWCalledValue::getCalledValue(this_01);
        if (in_stack_ffffffffffffffa0 != (Dumper *)0x0) {
          printf("<tr><td></td><td>------ undef call ------</td></tr>\n");
          dumpDefines(in_stack_ffffffffffffffa0,in_RDI);
          dumpOverwrites(in_stack_ffffffffffffffa0,in_RDI);
          dumpUses(in_stack_ffffffffffffffa0,in_RDI);
        }
        __gnu_cxx::
        __normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
        ::operator++((__normal_iterator<dg::dda::RWCalledValue_*,_std::vector<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>_>
                      *)&stack0xffffffffffffffb8);
      }
    }
    puts("</table>>");
    printf(" style=filled fillcolor=white shape=box]\n");
  }
  return;
}

Assistant:

void nodeToDot(RWNode *node) {
        static std::set<RWNode *> _dumped;
        if (!_dumped.insert(node).second) // already dumped
            return;

        printf("\tNODE%p ", static_cast<const void *>(node));
        printf("[label=<<table border=\"0\"><tr><td>(%u)</td> ", node->getID());
        printf("<td><font color=\"#af0000\">");
        printName(node);
        printf("</font></td>");
        printf("</tr>\n");

        if (node->getSize() > 0) {
            printf("<tr><td></td><td>size: %zu</td></tr>\n", node->getSize());
        }

        if (verbose) {
            printf("<tr><td>type:</td><td>");
            printRWNodeType(node->getType());
            printf("</td></tr>\n");
            printf("<tr><td colspan=\"2\">bblock: %p</td></tr>\n",
                   node->getBBlock());
            dumpDefines(node);
            dumpOverwrites(node);
            dumpUses(node);
        }

        // dumped data for undefined functions
        // (call edges will be dumped with other edges)
        if (auto *C = RWNodeCall::get(node)) {
            for (auto &cv : C->getCallees()) {
                if (const RWNode *undef = cv.getCalledValue()) {
                    printf("<tr><td></td><td>------ undef call "
                           "------</td></tr>\n");
                    dumpDefines(undef);
                    dumpOverwrites(undef);
                    dumpUses(undef);
                }
            }
        }

        puts("</table>>"); // end of label
        printf(" style=filled fillcolor=white shape=box]\n");
    }